

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int decode_key_share_entry(uint16_t *group,ptls_iovec_t *key_exchange,uint8_t **src,uint8_t *end)

{
  ushort *puVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  
  puVar1 = (ushort *)*src;
  iVar2 = 0x32;
  if (1 < (long)end - (long)puVar1) {
    *group = *puVar1 << 8 | *puVar1 >> 8;
    *src = (uint8_t *)(puVar1 + 1);
    iVar2 = 0x32;
    if (1 < (ulong)((long)end - (long)*src)) {
      uVar3 = (long)end - (long)*src;
      lVar7 = -2;
      uVar6 = 0;
      pbVar4 = *src;
      do {
        pbVar5 = pbVar4 + 1;
        *src = pbVar5;
        uVar6 = (ulong)*pbVar4 | uVar6 << 8;
        uVar3 = uVar3 - 1;
        lVar7 = lVar7 + 1;
        pbVar4 = pbVar5;
      } while (lVar7 != 0);
      if (uVar6 <= uVar3) {
        key_exchange->base = pbVar5;
        key_exchange->len = uVar6;
        *src = pbVar5 + uVar6;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int decode_key_share_entry(uint16_t *group, ptls_iovec_t *key_exchange, const uint8_t **src, const uint8_t *const end)
{
    int ret;

    if ((ret = ptls_decode16(group, src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(*src, end, 2, {
        *key_exchange = ptls_iovec_init(*src, end - *src);
        *src = end;
    });

Exit:
    return ret;
}